

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::AllContentModel::validateContentSpecial
          (AllContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          GrammarResolver *pGrammarResolver,XMLStringPool *pStringPool,XMLSize_t *indexFailingChild,
          MemoryManager *manager)

{
  QName *anElement;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  SubstitutionGroupComparator comparator;
  ulong local_70;
  SubstitutionGroupComparator local_40;
  void *__s;
  
  if (childCount == 0) {
    if (this->fHasOptionalContent != false) {
      return true;
    }
    if (this->fNumRequired == 0) {
      return true;
    }
    local_70 = 0;
  }
  else {
    local_40.fGrammarResolver = pGrammarResolver;
    local_40.fStringPool = pStringPool;
    iVar2 = (*manager->_vptr_MemoryManager[3])
                      (manager,this->fCount,childCount,CONCAT44(in_register_0000000c,param_3));
    __s = (void *)CONCAT44(extraout_var,iVar2);
    if (this->fCount != 0) {
      memset(__s,0,this->fCount);
    }
    local_70 = 0;
    XVar4 = 0;
    do {
      anElement = children[XVar4];
      if ((this->fIsMixed != true) || (iVar2 = 7, anElement->fURIId != 0xffffffff)) {
        if (this->fCount == 0) {
          XVar3 = 0;
        }
        else {
          XVar3 = 0;
          do {
            bVar1 = SubstitutionGroupComparator::isEquivalentTo
                              (&local_40,anElement,this->fChildren[XVar3]);
            iVar2 = 0;
            if (bVar1) {
              if (*(char *)((long)__s + XVar3) == '\x01') {
                *indexFailingChild = XVar4;
                iVar2 = 1;
              }
              else {
                *(undefined1 *)((long)__s + XVar3) = 1;
                local_70 = local_70 + ((ulong)this->fChildOptional[XVar3] ^ 1);
                iVar2 = 8;
              }
            }
            if (iVar2 != 0) {
              if (iVar2 != 8) goto LAB_002ed8b6;
              break;
            }
            XVar3 = XVar3 + 1;
          } while (XVar3 < this->fCount);
        }
        iVar2 = 0;
        if (XVar3 == this->fCount) {
          *indexFailingChild = XVar4;
          iVar2 = 1;
        }
      }
LAB_002ed8b6:
      if ((iVar2 != 7) && (iVar2 != 0)) goto LAB_002ed8d2;
      XVar4 = XVar4 + 1;
    } while (XVar4 != childCount + (childCount == 0));
    iVar2 = 5;
LAB_002ed8d2:
    if (__s != (void *)0x0) {
      if (manager == (MemoryManager *)0x0) {
        operator_delete__(__s);
      }
      else {
        (*manager->_vptr_MemoryManager[4])();
      }
    }
    if ((iVar2 != 0) && (iVar2 != 5)) {
      return false;
    }
  }
  if (local_70 != this->fNumRequired) {
    *indexFailingChild = childCount;
    return false;
  }
  return true;
}

Assistant:

bool AllContentModel::validateContentSpecial(QName** const          children
                                          , XMLSize_t               childCount
                                          , unsigned int
                                          , GrammarResolver*  const pGrammarResolver
                                          , XMLStringPool*    const pStringPool
                                          , XMLSize_t*              indexFailingChild
                                          , MemoryManager*    const manager) const
{
    // If <all> had minOccurs of zero and there are
    // no children to validate, trivially validate
    if (childCount == 0 && (fHasOptionalContent || !fNumRequired))
        return true;

    // keep track of the required element seen
    XMLSize_t numRequiredSeen = 0;

    if(childCount > 0)
    {
        SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

        // Check for duplicate element
        bool* elementSeen = (bool*) manager->allocate(fCount*sizeof(bool)); //new bool[fCount];

        const ArrayJanitor<bool> jan(elementSeen, manager);

        // initialize the array
        for (XMLSize_t i = 0; i < fCount; i++)
            elementSeen[i] = false;

        for (XMLSize_t outIndex = 0; outIndex < childCount; outIndex++) {
            // Get the current child out of the source index
            QName* const curChild = children[outIndex];

            // If it's PCDATA, then we just accept that
            if (fIsMixed && curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            // And try to find it in our list
            XMLSize_t inIndex = 0;
            for (; inIndex < fCount; inIndex++)
            {
                QName* const inChild = fChildren[inIndex];
                if ( comparator.isEquivalentTo(curChild, inChild)) {
                    // match
                    // If this element was seen already, indicate an error was
                    // found at the duplicate index.
                    if (elementSeen[inIndex]) {
                        *indexFailingChild=outIndex;
                        return false;
                    }
                    else
                        elementSeen[inIndex] = true;

                    if (!fChildOptional[inIndex])
                        numRequiredSeen++;

                    break;
                }
            }

            // We did not find this one, so the validation failed
            if (inIndex == fCount) {
                *indexFailingChild=outIndex;
                return false;
            }

        }
    }

    // Were all the required elements of the <all> encountered?
    if (numRequiredSeen != fNumRequired) {
        *indexFailingChild=childCount;
        return false;
    }

    // Everything seems to be ok, so return success
    return true;

}